

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasmbox.c
# Opt level: O2

int parse_limit(wasmbox_input_stream_t *ins,wasmbox_limit_t *limit)

{
  wasm_u8_t wVar1;
  wasm_u32_t wVar2;
  wasm_u64_t wVar3;
  
  wVar1 = wasmbox_input_stream_read_u8(ins);
  wVar3 = wasmbox_parse_unsigned_leb128(ins->data + ins->index,&ins->index,ins->length);
  limit->min = (wasm_u32_t)wVar3;
  if (wVar1 == '\0') {
    wVar2 = 0xffffffff;
  }
  else {
    wVar3 = wasmbox_parse_unsigned_leb128(ins->data + ins->index,&ins->index,ins->length);
    wVar2 = (wasm_u32_t)wVar3;
  }
  limit->max = wVar2;
  return wVar2;
}

Assistant:

static int parse_limit(wasmbox_input_stream_t *ins, wasmbox_limit_t *limit) {
  wasm_u8_t has_upper_limit = wasmbox_input_stream_read_u8(ins);
  limit->min = wasmbox_parse_unsigned_leb128(ins->data + ins->index,
                                             &ins->index, ins->length);
  if (has_upper_limit) {
    limit->max = wasmbox_parse_unsigned_leb128(ins->data + ins->index,
                                               &ins->index, ins->length);
  } else {
    limit->max = WASM_U32_MAX;
  }
  return 0;
}